

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O0

Gia_Man_t * Gia_ManCheckFalse(Gia_Man_t *p,int nSlackMax,int nTimeOut,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *p_01;
  bool bVar4;
  int local_48;
  int Changed0;
  int LevelMax;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Int_t *vTried;
  int Changed;
  int Tried;
  int fVeryVerbose_local;
  int fVerbose_local;
  int nTimeOut_local;
  int nSlackMax_local;
  Gia_Man_t *p_local;
  
  vTried._4_4_ = 0;
  vTried._0_4_ = 0;
  _nTimeOut_local = Gia_ManDup(p);
  iVar2 = Gia_ManCoNum(_nTimeOut_local);
  p_00 = Vec_IntStart(iVar2);
  do {
    uVar1 = (uint)vTried;
    local_48 = Gia_ManLevelNum(_nTimeOut_local);
    Changed0 = 0;
    while( true ) {
      iVar2 = Vec_IntSize(_nTimeOut_local->vCos);
      bVar4 = false;
      if (Changed0 < iVar2) {
        _LevelMax = Gia_ManCo(_nTimeOut_local,Changed0);
        bVar4 = _LevelMax != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      pGVar3 = Gia_ObjFanin0(_LevelMax);
      iVar2 = Gia_ObjIsAnd(pGVar3);
      if (iVar2 != 0) {
        pGVar3 = Gia_ObjFanin0(_LevelMax);
        iVar2 = Gia_ObjLevel(_nTimeOut_local,pGVar3);
        if ((local_48 - nSlackMax <= iVar2) && (iVar2 = Vec_IntEntry(p_00,Changed0), iVar2 == 0)) {
          vTried._4_4_ = vTried._4_4_ + 1;
          iVar2 = Gia_ObjFaninId0p(_nTimeOut_local,_LevelMax);
          p_01 = Gia_ManCheckOne(_nTimeOut_local,Changed0,iVar2,nTimeOut,fVerbose,fVeryVerbose);
          if (p_01 == (Gia_Man_t *)0x0) {
            Vec_IntWriteEntry(p_00,Changed0,1);
          }
          else {
            vTried._0_4_ = (uint)vTried + 1;
            Gia_ManStop(_nTimeOut_local);
            local_48 = Gia_ManLevelNum(p_01);
            _nTimeOut_local = p_01;
          }
        }
      }
      Changed0 = Changed0 + 1;
    }
  } while (uVar1 != (uint)vTried);
  printf("Performed %d attempts and %d changes.\n",(ulong)vTried._4_4_,(ulong)(uint)vTried);
  Vec_IntFree(p_00);
  return _nTimeOut_local;
}

Assistant:

Gia_Man_t * Gia_ManCheckFalse( Gia_Man_t * p, int nSlackMax, int nTimeOut, int fVerbose, int fVeryVerbose )
{
    int Tried = 0, Changed = 0;
    Vec_Int_t * vTried;
//    srand( 111 );
    p = Gia_ManDup( p );
    vTried = Vec_IntStart( Gia_ManCoNum(p) );
    while ( 1 )
    {
        Gia_Man_t * pNew;
        Gia_Obj_t * pObj;
        int i, LevelMax, Changed0 = Changed;
        LevelMax = Gia_ManLevelNum( p );
        Gia_ManForEachCo( p, pObj, i )
        {
            if ( !Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
                continue;
            if ( Gia_ObjLevel(p, Gia_ObjFanin0(pObj)) < LevelMax - nSlackMax )
                continue;
            if ( Vec_IntEntry( vTried, i ) )
                continue;
            Tried++;
            pNew = Gia_ManCheckOne( p, i, Gia_ObjFaninId0p(p, pObj), nTimeOut, fVerbose, fVeryVerbose );
/*
            if ( i != 126 && pNew )
            {
                Gia_ManStop( pNew );
                pNew = NULL;
            }
*/
            if ( pNew == NULL )
            {
                Vec_IntWriteEntry( vTried, i, 1 );
                continue;
            }
            Changed++;
            Gia_ManStop( p );
            p = pNew;
            LevelMax = Gia_ManLevelNum( p );
        }
        if ( Changed0 == Changed )
            break;
    }
//    if ( fVerbose )
        printf( "Performed %d attempts and %d changes.\n", Tried, Changed );
    Vec_IntFree( vTried );
    return p;
}